

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeptData.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
PeptData::SegmentsMass
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,PeptData *this,
          char *sequence,size_t sequence_length,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *cleavage_sites)

{
  pointer puVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  double segment;
  out_of_range e;
  value_type_conflict2 local_58;
  vector<double,_std::allocator<double>_> *local_50;
  size_t local_48;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = 0;
  local_50 = __return_storage_ptr__;
  local_48 = sequence_length;
  while( true ) {
    uVar6 = (ulong)uVar5;
    puVar1 = (cleavage_sites->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(cleavage_sites->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
    if (uVar3 <= uVar6) break;
    sVar7 = local_48;
    if (uVar3 - 1 != uVar6) {
      sVar7 = (size_t)puVar1[uVar5 + 1];
    }
    uVar4 = puVar1[uVar6];
    local_58 = 0.0;
    for (; uVar4 < sVar7; uVar4 = uVar4 + 1) {
      pmVar2 = std::__detail::
               _Map_base<char,_std::pair<const_char,_double>,_std::allocator<std::pair<const_char,_double>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<char,_std::pair<const_char,_double>,_std::allocator<std::pair<const_char,_double>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->mass_table_,sequence + uVar4);
      local_58 = *pmVar2 + local_58;
    }
    std::vector<double,_std::allocator<double>_>::push_back(local_50,&local_58);
    uVar5 = uVar5 + 1;
  }
  return local_50;
}

Assistant:

std::vector<double> SegmentsMass(const char* sequence, size_t sequence_length,
                                     const std::vector<unsigned>& cleavage_sites) const {
        std::vector<double> segments_mass;
        for (unsigned i = 0; i < cleavage_sites.size(); ++i) {
            auto start = cleavage_sites[i];
            auto end = i == cleavage_sites.size() - 1
                       ? sequence_length
                       : cleavage_sites[i + 1];
            double segment = 0;
            try {
                for (auto j = start; j < end; ++j) {
                    segment += mass_table_.at(sequence[j]);  // will throw an exception if no such character in table
                }
            }
            catch (std::out_of_range e) {
                segment = 0;  // if there is an error, the segment equals to 0
            }
            segments_mass.push_back(segment);
        }
        return segments_mass;
    }